

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

bool __thiscall QSocks5SocketEngine::connectInternal(QSocks5SocketEngine *this)

{
  QSocks5SocketEnginePrivate *this_00;
  QTcpSocket *pQVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  quint16 qVar5;
  SocketType SVar6;
  quint16 port;
  char *address;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  QHostAddress local_38;
  long local_30;
  
  this_01 = &local_58;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  if (this_00->data == (QSocks5Data *)0x0) {
    SVar6 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    if (SVar6 != TcpSocket) {
      SVar6 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
      if (SVar6 != UdpSocket) {
        local_58.d._0_4_ = 2;
        local_58.size._4_4_ = 0;
        local_58._4_8_ = 0;
        local_58._12_8_ = 0;
        local_40 = "default";
        address = "QSocks5SocketEngine::connectToHost: in QTcpServer mode";
        QMessageLogger::fatal((char *)&local_58);
        lVar2 = *(long *)((long)this_01 + 8);
        QAbstractSocketEngine::setPeerAddress
                  ((QAbstractSocketEngine *)this_01,(QHostAddress *)address);
        QAbstractSocketEngine::setPeerPort((QAbstractSocketEngine *)this_01,port);
        QString::clear((QString *)(lVar2 + 0x118));
        bVar4 = connectInternal((QSocks5SocketEngine *)this_01);
        return bVar4;
      }
      QSocks5SocketEnginePrivate::initialize(this_00,UdpAssociateMode);
      latin1.m_data = "0.0.0.0";
      latin1.m_size = 7;
      QString::QString((QString *)&local_58,latin1);
      QHostAddress::QHostAddress(&local_38,(QString *)&local_58);
      bVar4 = false;
      cVar3 = (**(code **)(*(long *)this + 0x90))(this,&local_38,0);
      QHostAddress::~QHostAddress(&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (cVar3 != '\0') {
        QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectedState);
        bVar4 = true;
      }
      goto LAB_00220872;
    }
    QSocks5SocketEnginePrivate::initialize(this_00,ConnectMode);
  }
  if ((this_00->super_QAbstractSocketEnginePrivate).socketState != ConnectingState) {
    if ((this_00->socks5State & ~AuthenticatingError) == Uninitialized) {
      QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectingState);
      pQVar1 = this_00->data->controlSocket;
      (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0x108))(pQVar1,0x10000);
    }
    pQVar1 = this_00->data->controlSocket;
    QNetworkProxy::hostName((QString *)&local_58,&this_00->proxyInfo);
    qVar5 = QNetworkProxy::port(&this_00->proxyInfo);
    (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0xf8))(pQVar1,&local_58,qVar5,3,2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  bVar4 = false;
LAB_00220872:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::connectInternal()
{
    Q_D(QSocks5SocketEngine);

    if (!d->data) {
        if (socketType() == QAbstractSocket::TcpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::ConnectMode);
#ifndef QT_NO_UDPSOCKET
        } else if (socketType() == QAbstractSocket::UdpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
            // all udp needs to be bound
            if (!bind(QHostAddress("0.0.0.0"_L1), 0))
                return false;

            setState(QAbstractSocket::ConnectedState);
            return true;
#endif
        } else {
            qFatal("QSocks5SocketEngine::connectToHost: in QTcpServer mode");
            return false;
        }
    }

    if (d->socketState != QAbstractSocket::ConnectingState) {
        if (d->socks5State == QSocks5SocketEnginePrivate::Uninitialized
            // We may have new auth credentials since an earlier failure:
         || d->socks5State == QSocks5SocketEnginePrivate::AuthenticatingError) {
            setState(QAbstractSocket::ConnectingState);
            //limit buffer in internal socket, data is buffered in the external socket under application control
            d->data->controlSocket->setReadBufferSize(65536);
        }

        d->data->controlSocket->connectToHost(d->proxyInfo.hostName(), d->proxyInfo.port());
    }

    return false;
}